

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O1

IXML_Attr * ixmlElement_getAttributeNode(IXML_Element *element,char *name)

{
  int iVar1;
  IXML_Attr *pIVar2;
  
  if (name == (char *)0x0 || element == (IXML_Element *)0x0) {
    pIVar2 = (IXML_Attr *)0x0;
  }
  else {
    pIVar2 = (IXML_Attr *)(element->n).firstAttr;
    while ((pIVar2 != (IXML_Attr *)0x0 && (iVar1 = strcmp((pIVar2->n).nodeName,name), iVar1 != 0)))
    {
      pIVar2 = (IXML_Attr *)(pIVar2->n).nextSibling;
    }
  }
  return pIVar2;
}

Assistant:

IXML_Attr *ixmlElement_getAttributeNode(
	IXML_Element *element, const DOMString name)
{
	IXML_Node *attrNode;

	if (element == NULL || name == NULL) {
		return NULL;
	}

	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->nodeName, name) == 0) {
			/* found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}

	return (IXML_Attr *)attrNode;
}